

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O3

ServiceClient __thiscall
miniros::NodeHandle::serviceClient(NodeHandle *this,ServiceClientOptions *ops)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  string *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  ServiceClient SVar6;
  string local_40;
  
  resolveName(&local_40,(NodeHandle *)ops,in_RDX,true);
  std::__cxx11::string::operator=((string *)in_RDX,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  ServiceClient::ServiceClient
            ((ServiceClient *)this,in_RDX,*(bool *)&in_RDX[2]._M_dataplus._M_p,
             (M_string *)&in_RDX[2]._M_string_length,in_RDX + 1);
  bVar3 = ServiceClient::isValid((ServiceClient *)this);
  _Var5._M_pi = extraout_RDX;
  if (bVar3) {
    lVar1 = *(long *)(ops + 0xa8);
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)(lVar1 + 0x60));
    if (iVar4 != 0) {
      std::__throw_system_error(iVar4);
    }
    lVar2 = *(long *)(ops + 0xa8);
    local_40._M_dataplus._M_p = (this->namespace_)._M_dataplus._M_p;
    local_40._M_string_length = (this->namespace_)._M_string_length;
    if ((long *)local_40._M_string_length != (long *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(local_40._M_string_length + 0xc) = *(int *)(local_40._M_string_length + 0xc) + 1;
        UNLOCK();
      }
      else {
        *(int *)(local_40._M_string_length + 0xc) = *(int *)(local_40._M_string_length + 0xc) + 1;
      }
    }
    std::
    vector<std::weak_ptr<miniros::ServiceClient::Impl>,std::allocator<std::weak_ptr<miniros::ServiceClient::Impl>>>
    ::emplace_back<std::weak_ptr<miniros::ServiceClient::Impl>>
              ((vector<std::weak_ptr<miniros::ServiceClient::Impl>,std::allocator<std::weak_ptr<miniros::ServiceClient::Impl>>>
                *)(lVar2 + 0x48),(weak_ptr<miniros::ServiceClient::Impl> *)&local_40);
    if ((long *)local_40._M_string_length != (long *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        lVar2 = local_40._M_string_length + 0xc;
        iVar4 = *(int *)lVar2;
        *(int *)lVar2 = *(int *)lVar2 + -1;
        UNLOCK();
      }
      else {
        iVar4 = *(int *)(local_40._M_string_length + 0xc);
        *(int *)(local_40._M_string_length + 0xc) = iVar4 + -1;
      }
      if (iVar4 == 1) {
        (**(code **)(*(long *)local_40._M_string_length + 0x18))();
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)(lVar1 + 0x60));
    _Var5._M_pi = extraout_RDX_00;
  }
  SVar6.impl_.super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var5._M_pi;
  SVar6.impl_.super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ServiceClient)
         SVar6.impl_.super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ServiceClient NodeHandle::serviceClient(ServiceClientOptions& ops)
{
  ops.service = resolveName(ops.service);
  ServiceClient client(ops.service, ops.persistent, ops.header, ops.md5sum);

  if (client)
  {
    std::scoped_lock<std::mutex> lock(collection_->mutex_);
    collection_->srv_cs_.push_back(client.impl_);
  }

  return client;
}